

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-256.c
# Opt level: O1

void pp_crypto_hash_sha2_256_process(PHashSHA2_256 *ctx,puint32 *data)

{
  uint uVar1;
  uint uVar2;
  puint32 pVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  uint auStack_158 [8];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  uint auStack_f8 [50];
  
  local_178 = *(undefined8 *)ctx->hash;
  uStack_170 = *(undefined8 *)(ctx->hash + 2);
  local_168 = *(undefined8 *)(ctx->hash + 4);
  uVar4 = *(undefined8 *)(ctx->hash + 6);
  uStack_160 = uVar4;
  local_138 = *(undefined8 *)data;
  uStack_130 = *(undefined8 *)(data + 2);
  local_128 = *(undefined8 *)(data + 4);
  uStack_120 = *(undefined8 *)(data + 6);
  local_118 = *(undefined8 *)(data + 8);
  uStack_110 = *(undefined8 *)(data + 10);
  local_108 = *(undefined8 *)(data + 0xc);
  uStack_100 = *(undefined8 *)(data + 0xe);
  uStack_160._4_4_ = (uint)((ulong)uVar4 >> 0x20);
  local_168._4_4_ = (uint)((ulong)local_168 >> 0x20);
  uStack_160._0_4_ = (uint)uVar4;
  local_178._4_4_ = (uint)((ulong)local_178 >> 0x20);
  lVar9 = 7;
  uStack_170._4_4_ = (uint)((ulong)uStack_170 >> 0x20);
  do {
    iVar5 = (((uint)local_168 << 7 | (uint)local_168 >> 0x19) ^
            ((uint)local_168 << 0x15 | (uint)local_168 >> 0xb) ^
            ((uint)local_168 << 0x1a | (uint)local_168 >> 6)) + uStack_160._4_4_ +
            *(int *)(pp_crypto_hash_sha1_pad + lVar9 * 4 + 0x24) + auStack_158[lVar9 + 1] +
            ((local_168._4_4_ ^ (uint)uStack_160) & (uint)local_168 ^ (uint)uStack_160);
    uStack_170._4_4_ = uStack_170._4_4_ + iVar5;
    uStack_160._4_4_ =
         ((local_178._4_4_ | (uint)local_178) & (uint)uStack_170 | local_178._4_4_ & (uint)local_178
         ) + (((uint)local_178 << 10 | (uint)local_178 >> 0x16) ^
             ((uint)local_178 << 0x13 | (uint)local_178 >> 0xd) ^
             ((uint)local_178 << 0x1e | (uint)local_178 >> 2)) + iVar5;
    iVar5 = ((local_168._4_4_ ^ (uint)local_168) & uStack_170._4_4_ ^ local_168._4_4_) +
            (uint)uStack_160 + *(int *)(pp_crypto_hash_sha1_pad + lVar9 * 4 + 0x28) +
            ((uStack_170._4_4_ * 0x80 | uStack_170._4_4_ >> 0x19) ^
            (uStack_170._4_4_ * 0x200000 | uStack_170._4_4_ >> 0xb) ^
            (uStack_170._4_4_ * 0x4000000 | uStack_170._4_4_ >> 6)) + auStack_158[lVar9 + 2];
    uStack_170._0_4_ = (uint)uStack_170 + iVar5;
    uStack_160._0_4_ =
         ((uStack_160._4_4_ | (uint)local_178) & local_178._4_4_ |
         uStack_160._4_4_ & (uint)local_178) +
         ((uStack_160._4_4_ * 0x400 | uStack_160._4_4_ >> 0x16) ^
         (uStack_160._4_4_ * 0x80000 | uStack_160._4_4_ >> 0xd) ^
         (uStack_160._4_4_ * 0x40000000 | uStack_160._4_4_ >> 2)) + iVar5;
    iVar5 = local_168._4_4_ + *(int *)(pp_crypto_hash_sha1_pad + lVar9 * 4 + 0x2c) +
            auStack_158[lVar9 + 3] +
            ((uStack_170._4_4_ ^ (uint)local_168) & (uint)uStack_170 ^ (uint)local_168) +
            (((uint)uStack_170 * 0x80 | (uint)uStack_170 >> 0x19) ^
            ((uint)uStack_170 * 0x200000 | (uint)uStack_170 >> 0xb) ^
            ((uint)uStack_170 * 0x4000000 | (uint)uStack_170 >> 6));
    local_178._4_4_ = local_178._4_4_ + iVar5;
    local_168._4_4_ =
         iVar5 + (((uint)uStack_160 | uStack_160._4_4_) & (uint)local_178 |
                 (uint)uStack_160 & uStack_160._4_4_) +
                 (((uint)uStack_160 * 0x400 | (uint)uStack_160 >> 0x16) ^
                 ((uint)uStack_160 * 0x80000 | (uint)uStack_160 >> 0xd) ^
                 ((uint)uStack_160 * 0x40000000 | (uint)uStack_160 >> 2));
    iVar5 = (uint)local_168 + *(int *)(pp_crypto_hash_sha1_pad + lVar9 * 4 + 0x30) +
            auStack_158[lVar9 + 4] +
            (((uint)uStack_170 ^ uStack_170._4_4_) & local_178._4_4_ ^ uStack_170._4_4_) +
            ((local_178._4_4_ * 0x80 | local_178._4_4_ >> 0x19) ^
            (local_178._4_4_ * 0x200000 | local_178._4_4_ >> 0xb) ^
            (local_178._4_4_ * 0x4000000 | local_178._4_4_ >> 6));
    local_178._0_4_ = (uint)local_178 + iVar5;
    local_168._0_4_ =
         iVar5 + ((local_168._4_4_ | (uint)uStack_160) & uStack_160._4_4_ |
                 local_168._4_4_ & (uint)uStack_160) +
                 ((local_168._4_4_ * 0x400 | local_168._4_4_ >> 0x16) ^
                 (local_168._4_4_ * 0x80000 | local_168._4_4_ >> 0xd) ^
                 (local_168._4_4_ * 0x40000000 | local_168._4_4_ >> 2));
    iVar5 = uStack_170._4_4_ + *(int *)(pp_crypto_hash_sha1_pad + lVar9 * 4 + 0x34) +
            auStack_158[lVar9 + 5] +
            ((local_178._4_4_ ^ (uint)uStack_170) & (uint)local_178 ^ (uint)uStack_170) +
            (((uint)local_178 * 0x80 | (uint)local_178 >> 0x19) ^
            ((uint)local_178 * 0x200000 | (uint)local_178 >> 0xb) ^
            ((uint)local_178 * 0x4000000 | (uint)local_178 >> 6));
    uStack_160._4_4_ = uStack_160._4_4_ + iVar5;
    uStack_170._4_4_ =
         (((uint)local_168 | local_168._4_4_) & (uint)uStack_160 | (uint)local_168 & local_168._4_4_
         ) + (((uint)local_168 * 0x400 | (uint)local_168 >> 0x16) ^
             ((uint)local_168 * 0x80000 | (uint)local_168 >> 0xd) ^
             ((uint)local_168 * 0x40000000 | (uint)local_168 >> 2)) + iVar5;
    iVar5 = (uint)uStack_170 + *(int *)(pp_crypto_hash_sha1_pad + lVar9 * 4 + 0x38) +
            auStack_158[lVar9 + 6] +
            (((uint)local_178 ^ local_178._4_4_) & uStack_160._4_4_ ^ local_178._4_4_) +
            ((uStack_160._4_4_ * 0x80 | uStack_160._4_4_ >> 0x19) ^
            (uStack_160._4_4_ * 0x200000 | uStack_160._4_4_ >> 0xb) ^
            (uStack_160._4_4_ * 0x4000000 | uStack_160._4_4_ >> 6));
    uStack_160._0_4_ = (uint)uStack_160 + iVar5;
    uStack_170._0_4_ =
         ((uStack_170._4_4_ | (uint)local_168) & local_168._4_4_ |
         uStack_170._4_4_ & (uint)local_168) +
         ((uStack_170._4_4_ * 0x400 | uStack_170._4_4_ >> 0x16) ^
         (uStack_170._4_4_ * 0x80000 | uStack_170._4_4_ >> 0xd) ^
         (uStack_170._4_4_ * 0x40000000 | uStack_170._4_4_ >> 2)) + iVar5;
    iVar5 = local_178._4_4_ + *(int *)(pp_crypto_hash_sha1_pad + lVar9 * 4 + 0x3c) +
            auStack_158[lVar9 + 7] +
            ((uStack_160._4_4_ ^ (uint)local_178) & (uint)uStack_160 ^ (uint)local_178) +
            (((uint)uStack_160 * 0x80 | (uint)uStack_160 >> 0x19) ^
            ((uint)uStack_160 * 0x200000 | (uint)uStack_160 >> 0xb) ^
            ((uint)uStack_160 * 0x4000000 | (uint)uStack_160 >> 6));
    local_168._4_4_ = local_168._4_4_ + iVar5;
    local_178._4_4_ =
         (((uint)uStack_170 | uStack_170._4_4_) & (uint)local_168 |
         (uint)uStack_170 & uStack_170._4_4_) +
         (((uint)uStack_170 * 0x400 | (uint)uStack_170 >> 0x16) ^
         ((uint)uStack_170 * 0x80000 | (uint)uStack_170 >> 0xd) ^
         ((uint)uStack_170 * 0x40000000 | (uint)uStack_170 >> 2)) + iVar5;
    iVar5 = (uint)local_178 + pp_crypto_hash_sha2_256_K[lVar9] +
            *(int *)((long)&local_138 + lVar9 * 4) +
            (((uint)uStack_160 ^ uStack_160._4_4_) & local_168._4_4_ ^ uStack_160._4_4_) +
            ((local_168._4_4_ * 0x80 | local_168._4_4_ >> 0x19) ^
            (local_168._4_4_ * 0x200000 | local_168._4_4_ >> 0xb) ^
            (local_168._4_4_ * 0x4000000 | local_168._4_4_ >> 6));
    local_168._0_4_ = (uint)local_168 + iVar5;
    local_178._0_4_ =
         ((local_178._4_4_ | (uint)uStack_170) & uStack_170._4_4_ |
         local_178._4_4_ & (uint)uStack_170) +
         ((local_178._4_4_ * 0x400 | local_178._4_4_ >> 0x16) ^
         (local_178._4_4_ * 0x80000 | local_178._4_4_ >> 0xd) ^
         (local_178._4_4_ * 0x40000000 | local_178._4_4_ >> 2)) + iVar5;
    lVar9 = lVar9 + 8;
  } while (lVar9 == 0xf);
  uVar10 = 0x10;
  do {
    uVar1 = auStack_158[uVar10 + 6];
    uVar2 = *(uint *)((long)&local_178 + uVar10 * 4 + 4);
    uVar7 = *(uint *)((long)&uStack_170 + uVar10 * 4);
    uVar6 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
            auStack_158[uVar10 + 1] + *(int *)((long)&local_178 + uVar10 * 4) +
            (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    pVar3 = pp_crypto_hash_sha2_256_K[uVar10];
    *(uint *)((long)&local_138 + uVar10 * 4) = uVar6;
    iVar5 = (((uint)local_168 << 7 | (uint)local_168 >> 0x19) ^
            ((uint)local_168 << 0x15 | (uint)local_168 >> 0xb) ^
            ((uint)local_168 << 0x1a | (uint)local_168 >> 6)) + uStack_160._4_4_ + pVar3 +
            ((local_168._4_4_ ^ (uint)uStack_160) & (uint)local_168 ^ (uint)uStack_160) + uVar6;
    uStack_170._4_4_ = uStack_170._4_4_ + iVar5;
    uStack_160._4_4_ =
         ((local_178._4_4_ | (uint)local_178) & (uint)uStack_170 | local_178._4_4_ & (uint)local_178
         ) + (((uint)local_178 << 10 | (uint)local_178 >> 0x16) ^
             ((uint)local_178 << 0x13 | (uint)local_178 >> 0xd) ^
             ((uint)local_178 << 0x1e | (uint)local_178 >> 2)) + iVar5;
    uVar1 = auStack_158[uVar10 + 7];
    uVar8 = uVar2 + auStack_158[uVar10 + 2] +
            (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
            (uVar7 >> 3 ^ (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7));
    pVar3 = pp_crypto_hash_sha2_256_K[uVar10 + 1];
    *(uint *)((long)&local_138 + uVar10 * 4 + 4) = uVar8;
    iVar5 = ((uStack_170._4_4_ * 0x80 | uStack_170._4_4_ >> 0x19) ^
            (uStack_170._4_4_ * 0x200000 | uStack_170._4_4_ >> 0xb) ^
            (uStack_170._4_4_ * 0x4000000 | uStack_170._4_4_ >> 6)) + uVar8 +
            ((local_168._4_4_ ^ (uint)local_168) & uStack_170._4_4_ ^ local_168._4_4_) +
            (uint)uStack_160 + pVar3;
    uStack_170._0_4_ = (uint)uStack_170 + iVar5;
    uStack_160._0_4_ =
         ((uStack_160._4_4_ | (uint)local_178) & local_178._4_4_ |
         uStack_160._4_4_ & (uint)local_178) +
         ((uStack_160._4_4_ * 0x400 | uStack_160._4_4_ >> 0x16) ^
         (uStack_160._4_4_ * 0x80000 | uStack_160._4_4_ >> 0xd) ^
         (uStack_160._4_4_ * 0x40000000 | uStack_160._4_4_ >> 2)) + iVar5;
    uVar1 = *(uint *)((long)&uStack_170 + uVar10 * 4 + 4);
    uVar7 = (uVar6 >> 10 ^ (uVar6 * 0x2000 | uVar6 >> 0x13) ^ (uVar6 * 0x8000 | uVar6 >> 0x11)) +
            uVar7 + auStack_158[uVar10 + 3] +
            (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    pVar3 = pp_crypto_hash_sha2_256_K[uVar10 + 2];
    *(uint *)((long)&uStack_130 + uVar10 * 4) = uVar7;
    iVar5 = local_168._4_4_ + pVar3 +
            ((uStack_170._4_4_ ^ (uint)local_168) & (uint)uStack_170 ^ (uint)local_168) + uVar7 +
            (((uint)uStack_170 * 0x80 | (uint)uStack_170 >> 0x19) ^
            ((uint)uStack_170 * 0x200000 | (uint)uStack_170 >> 0xb) ^
            ((uint)uStack_170 * 0x4000000 | (uint)uStack_170 >> 6));
    local_178._4_4_ = local_178._4_4_ + iVar5;
    local_168._4_4_ =
         iVar5 + (((uint)uStack_160 | uStack_160._4_4_) & (uint)local_178 |
                 (uint)uStack_160 & uStack_160._4_4_) +
                 (((uint)uStack_160 * 0x400 | (uint)uStack_160 >> 0x16) ^
                 ((uint)uStack_160 * 0x80000 | (uint)uStack_160 >> 0xd) ^
                 ((uint)uStack_160 * 0x40000000 | (uint)uStack_160 >> 2));
    uVar2 = *(uint *)((long)&local_168 + uVar10 * 4);
    uVar11 = (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11)) +
             uVar1 + auStack_158[uVar10 + 4] +
             (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    *(uint *)((long)&uStack_130 + uVar10 * 4 + 4) = uVar11;
    iVar5 = (uint)local_168 + pp_crypto_hash_sha2_256_K[uVar10 + 3] + uVar11 +
            (((uint)uStack_170 ^ uStack_170._4_4_) & local_178._4_4_ ^ uStack_170._4_4_) +
            ((local_178._4_4_ * 0x80 | local_178._4_4_ >> 0x19) ^
            (local_178._4_4_ * 0x200000 | local_178._4_4_ >> 0xb) ^
            (local_178._4_4_ * 0x4000000 | local_178._4_4_ >> 6));
    local_178._0_4_ = (uint)local_178 + iVar5;
    local_168._0_4_ =
         iVar5 + ((local_168._4_4_ | (uint)uStack_160) & uStack_160._4_4_ |
                 local_168._4_4_ & (uint)uStack_160) +
                 ((local_168._4_4_ * 0x400 | local_168._4_4_ >> 0x16) ^
                 (local_168._4_4_ * 0x80000 | local_168._4_4_ >> 0xd) ^
                 (local_168._4_4_ * 0x40000000 | local_168._4_4_ >> 2));
    uVar1 = *(uint *)((long)&local_168 + uVar10 * 4 + 4);
    uVar8 = (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11)) +
            uVar2 + auStack_158[uVar10 + 5] +
            (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    *(uint *)((long)&local_128 + uVar10 * 4) = uVar8;
    iVar5 = uStack_170._4_4_ + pp_crypto_hash_sha2_256_K[uVar10 + 4] + uVar8 +
            ((local_178._4_4_ ^ (uint)uStack_170) & (uint)local_178 ^ (uint)uStack_170) +
            (((uint)local_178 * 0x80 | (uint)local_178 >> 0x19) ^
            ((uint)local_178 * 0x200000 | (uint)local_178 >> 0xb) ^
            ((uint)local_178 * 0x4000000 | (uint)local_178 >> 6));
    uStack_160._4_4_ = uStack_160._4_4_ + iVar5;
    uStack_170._4_4_ =
         (((uint)local_168 | local_168._4_4_) & (uint)uStack_160 | (uint)local_168 & local_168._4_4_
         ) + (((uint)local_168 * 0x400 | (uint)local_168 >> 0x16) ^
             ((uint)local_168 * 0x80000 | (uint)local_168 >> 0xd) ^
             ((uint)local_168 * 0x40000000 | (uint)local_168 >> 2)) + iVar5;
    uVar2 = auStack_158[uVar10 - 2];
    uVar7 = auStack_158[uVar10 - 1];
    uVar11 = (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             ) + uVar1 + auStack_158[uVar10 + 6] +
             (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    iVar5 = (uint)uStack_170 + pp_crypto_hash_sha2_256_K[uVar10 + 5] + uVar11 +
            (((uint)local_178 ^ local_178._4_4_) & uStack_160._4_4_ ^ local_178._4_4_) +
            ((uStack_160._4_4_ * 0x80 | uStack_160._4_4_ >> 0x19) ^
            (uStack_160._4_4_ * 0x200000 | uStack_160._4_4_ >> 0xb) ^
            (uStack_160._4_4_ * 0x4000000 | uStack_160._4_4_ >> 6));
    uStack_160._0_4_ = (uint)uStack_160 + iVar5;
    uStack_170._0_4_ =
         ((uStack_170._4_4_ | (uint)local_168) & local_168._4_4_ |
         uStack_170._4_4_ & (uint)local_168) +
         ((uStack_170._4_4_ * 0x400 | uStack_170._4_4_ >> 0x16) ^
         (uStack_170._4_4_ * 0x80000 | uStack_170._4_4_ >> 0xd) ^
         (uStack_170._4_4_ * 0x40000000 | uStack_170._4_4_ >> 2)) + iVar5;
    *(uint *)((long)&local_128 + uVar10 * 4 + 4) = uVar11;
    iVar5 = (uVar8 >> 10 ^ (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11)) +
            uVar2 + auStack_158[uVar10 + 7] +
            (uVar7 >> 3 ^ (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7));
    *(int *)((long)&uStack_120 + uVar10 * 4) = iVar5;
    iVar5 = local_178._4_4_ + pp_crypto_hash_sha2_256_K[uVar10 + 6] + iVar5 +
            ((uStack_160._4_4_ ^ (uint)local_178) & (uint)uStack_160 ^ (uint)local_178) +
            (((uint)uStack_160 * 0x80 | (uint)uStack_160 >> 0x19) ^
            ((uint)uStack_160 * 0x200000 | (uint)uStack_160 >> 0xb) ^
            ((uint)uStack_160 * 0x4000000 | (uint)uStack_160 >> 6));
    local_168._4_4_ = local_168._4_4_ + iVar5;
    local_178._4_4_ =
         (((uint)uStack_170 | uStack_170._4_4_) & (uint)local_168 |
         (uint)uStack_170 & uStack_170._4_4_) +
         (((uint)uStack_170 * 0x400 | (uint)uStack_170 >> 0x16) ^
         ((uint)uStack_170 * 0x80000 | (uint)uStack_170 >> 0xd) ^
         ((uint)uStack_170 * 0x40000000 | (uint)uStack_170 >> 2)) + iVar5;
    uVar1 = auStack_158[uVar10];
    iVar5 = uVar6 + uVar7 +
            (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7)) +
            (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11))
    ;
    pVar3 = pp_crypto_hash_sha2_256_K[uVar10 + 7];
    *(int *)((long)&uStack_120 + uVar10 * 4 + 4) = iVar5;
    iVar5 = (uint)local_178 + pVar3 + iVar5 +
            (((uint)uStack_160 ^ uStack_160._4_4_) & local_168._4_4_ ^ uStack_160._4_4_) +
            ((local_168._4_4_ * 0x80 | local_168._4_4_ >> 0x19) ^
            (local_168._4_4_ * 0x200000 | local_168._4_4_ >> 0xb) ^
            (local_168._4_4_ * 0x4000000 | local_168._4_4_ >> 6));
    local_168._0_4_ = (uint)local_168 + iVar5;
    local_178._0_4_ =
         ((local_178._4_4_ | (uint)uStack_170) & uStack_170._4_4_ |
         local_178._4_4_ & (uint)uStack_170) +
         ((local_178._4_4_ * 0x400 | local_178._4_4_ >> 0x16) ^
         (local_178._4_4_ * 0x80000 | local_178._4_4_ >> 0xd) ^
         (local_178._4_4_ * 0x40000000 | local_178._4_4_ >> 2)) + iVar5;
    bVar12 = uVar10 < 0x38;
    uVar10 = uVar10 + 8;
  } while (bVar12);
  lVar9 = 0;
  do {
    ctx->hash[lVar9] = ctx->hash[lVar9] + *(int *)((long)&local_178 + lVar9 * 4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_256_process (PHashSHA2_256	*ctx,
				 const puint32	data[16])
{
	puint32	tmp_sum1;
	puint32	tmp_sum2;
	puint32 W[64];
	puint32	A[8];
	puint	i;

	for (i = 0; i < 8; i++)
		A[i] = ctx->hash[i];

	memcpy (W, data, 64);

	for (i = 0; i < 16; i += 8) {
		P_SHA2_256_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i + 0], pp_crypto_hash_sha2_256_K[i + 0])
		P_SHA2_256_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i + 1], pp_crypto_hash_sha2_256_K[i + 1])
		P_SHA2_256_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i + 2], pp_crypto_hash_sha2_256_K[i + 2])
		P_SHA2_256_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i + 3], pp_crypto_hash_sha2_256_K[i + 3])
		P_SHA2_256_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i + 4], pp_crypto_hash_sha2_256_K[i + 4])
		P_SHA2_256_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i + 5], pp_crypto_hash_sha2_256_K[i + 5])
		P_SHA2_256_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i + 6], pp_crypto_hash_sha2_256_K[i + 6])
		P_SHA2_256_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i + 7], pp_crypto_hash_sha2_256_K[i + 7])
	}

	for (i = 16; i < 64; i += 8) {
		P_SHA2_256_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], P_SHA2_256_R (i + 0), pp_crypto_hash_sha2_256_K[i + 0])
		P_SHA2_256_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], P_SHA2_256_R (i + 1), pp_crypto_hash_sha2_256_K[i + 1])
		P_SHA2_256_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], P_SHA2_256_R (i + 2), pp_crypto_hash_sha2_256_K[i + 2])
		P_SHA2_256_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], P_SHA2_256_R (i + 3), pp_crypto_hash_sha2_256_K[i + 3])
		P_SHA2_256_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], P_SHA2_256_R (i + 4), pp_crypto_hash_sha2_256_K[i + 4])
		P_SHA2_256_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], P_SHA2_256_R (i + 5), pp_crypto_hash_sha2_256_K[i + 5])
		P_SHA2_256_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], P_SHA2_256_R (i + 6), pp_crypto_hash_sha2_256_K[i + 6])
		P_SHA2_256_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], P_SHA2_256_R (i + 7), pp_crypto_hash_sha2_256_K[i + 7])
	}

	for (i = 0; i < 8; i++)
		ctx->hash[i] += A[i];
}